

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
FindNextProperty_BigPropertyIndex
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          ScriptContext *scriptContext,unsigned_short *index,JavascriptString **propertyStringName,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  EnumeratorFlags EVar1;
  DynamicTypeHandler *pDVar2;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  JavascriptString *key;
  code *pcVar3;
  PropertyRecord *pPVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  PropertyId propertyId_00;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar10;
  JavascriptString **ppJVar11;
  PropertyString *pPVar12;
  PropertyRecord *local_70;
  PropertyRecord *propertyRecord;
  unsigned_short *local_60;
  ScriptContext *local_58;
  EnumeratorFlags *local_50;
  JavascriptString **local_48;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34 [2];
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  local_58 = scriptContext;
  local_50 = attributes;
  local_48 = propertyStringName;
  local_40 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f0,"(propertyStringName)","propertyStringName");
    if (!bVar5) goto LAB_00c8f164;
    *puVar8 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f1,"(propertyId)","propertyId");
    if (!bVar5) goto LAB_00c8f164;
    *puVar8 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f2,"(type)","type");
    if (!bVar5) goto LAB_00c8f164;
    *puVar8 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f3,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar5) {
LAB_00c8f164:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  if ((DynamicType *)type == typeToEnumerate) {
    uVar6 = *index;
    while (this_00 = (local_40->propertyMap).ptr,
          (int)(uint)uVar6 < this_00->count - this_00->freeCount) {
      pSVar10 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetValueAt(this_00,(uint)uVar6);
      EVar1 = pSVar10->Attributes;
      if (((EVar1 & (EphemeralReference|UseCache)) == None) &&
         (((flags & EnumNonEnumerable) != None || ((EVar1 & EnumNonEnumerable) != None)))) {
        ppJVar11 = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((local_40->propertyMap).ptr,(uint)*index);
        pSVar9 = local_58;
        key = *ppJVar11;
        if (local_50 != (EnumeratorFlags *)0x0) {
          *local_50 = EVar1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_58,key);
        *propertyId = propertyId_00;
        pPVar12 = ScriptContext::GetPropertyString(pSVar9,propertyId_00);
        *local_48 = &pPVar12->super_JavascriptString;
        return 1;
      }
      uVar6 = *index + 1;
      *index = uVar6;
    }
  }
  else {
    pDVar2 = (typeToEnumerate->typeHandler).ptr;
    propertyRecord = (PropertyRecord *)__tls_get_addr(&PTR_013e5f18);
    local_60 = index;
    while (iVar7 = (*pDVar2->_vptr_DynamicTypeHandler[10])
                             (pDVar2,local_58,index,local_48,propertyId,local_50,typeToEnumerate,
                              typeToEnumerate,(ulong)flags,instance,info), iVar7 != 0) {
      local_34[0]._0_1_ = 1;
      local_34[0].Attributes = '\a';
      local_34[0].propertyIndex = 0xffff;
      if (*propertyId == -1) {
        if (*local_48 != (JavascriptString *)0x0) {
          bVar5 = JsUtil::
                  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::JavascriptString*>
                            ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                              *)(local_40->propertyMap).ptr,local_48,local_34);
          goto LAB_00c8f09b;
        }
      }
      else {
        pSVar9 = Js::Type::GetScriptContext(type);
        local_70 = ScriptContext::GetPropertyName(pSVar9,*propertyId);
        if (((flags & EnumSymbols) == None) && (local_70->isSymbol == true)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pPVar4 = propertyRecord;
          *(undefined4 *)
           &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x32c,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar5) goto LAB_00c8f164;
          *(undefined4 *)
           &(pPVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
          index = local_60;
        }
        bVar5 = JsUtil::
                BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                ::TryGetValue<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                            *)(local_40->propertyMap).ptr,&local_70,local_34);
LAB_00c8f09b:
        if (((bVar5 != false) && (((uint)local_34[0] & 0x1800) == 0)) &&
           (((local_34[0].Attributes | flags) & EnumNonEnumerable) != None)) {
          if (local_50 != (EnumeratorFlags *)0x0) {
            *local_50 = local_34[0].Attributes;
          }
          return 1;
        }
      }
      *index = *index + 1;
    }
  }
  return 0;
}

Assistant:

inline BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty_BigPropertyIndex(ScriptContext* scriptContext, TPropertyIndex& index,
        JavascriptString** propertyStringName, PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    auto key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    *propertyStringName = scriptContext->GetPropertyString(*propertyId);

                    return TRUE;
                }
            }

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }
            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }

                return TRUE;
            }
        }

        return FALSE;
    }